

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toucs.c
# Opt level: O1

wchar_t charset_to_unicode(char **input,wchar_t *inlen,wchar_t *output,wchar_t outlen,
                          wchar_t charset,charset_state *state,wchar_t *errstr,wchar_t errlen)

{
  wchar_t *pwVar1;
  charset_spec *pcVar2;
  unicode_emit_param param;
  charset_state local_60;
  charset_state *local_58;
  wchar_t *local_50;
  wchar_t local_48;
  wchar_t *local_40;
  wchar_t local_38;
  int local_34;
  
  pcVar2 = charset_find_spec(charset);
  local_40 = errstr;
  local_38 = errlen;
  local_34 = 0;
  local_58 = state;
  local_50 = output;
  local_48 = outlen;
  if (state == (charset_state *)0x0) {
    local_60.s0 = 0;
  }
  else {
    local_60 = (charset_state)state->s0;
  }
  do {
    pwVar1 = local_50;
    if (*inlen < L'\x01') {
      return (wchar_t)((ulong)((long)local_50 - (long)output) >> 2);
    }
    (*pcVar2->read)(pcVar2,(long)**input,&local_60,unicode_emit,&local_50);
    if (local_34 == 0) {
      if (local_58 != (charset_state *)0x0) {
        local_58->s0 = local_60.s0;
      }
      *input = *input + 1;
      *inlen = *inlen + L'\xffffffff';
    }
    else {
      outlen = (wchar_t)((ulong)((long)pwVar1 - (long)output) >> 2);
    }
  } while (local_34 == 0);
  return outlen;
}

Assistant:

int charset_to_unicode(const char **input, int *inlen,
                       wchar_t *output, int outlen,
                       int charset, charset_state *state,
                       const wchar_t *errstr, int errlen)
{
    charset_spec const *spec = charset_find_spec(charset);
    charset_state localstate;
    struct unicode_emit_param param;

    param.output = output;
    param.outlen = outlen;
    param.errstr = errstr;
    param.errlen = errlen;
    param.stopped = 0;

    if (!state) {
        localstate.s0 = 0;
    } else {
        localstate = *state;           /* structure copy */
    }

    while (*inlen > 0) {
        int lenbefore = param.output - output;
        spec->read(spec, (unsigned char)**input, &localstate,
                   unicode_emit, &param);
        if (param.stopped) {
            /*
             * The emit function has _tried_ to output some
             * characters, but ran up against the end of the
             * buffer. Leave immediately, and return what happened
             * _before_ attempting to process this character.
             */
            return lenbefore;
        }
        if (state)
            *state = localstate;   /* structure copy */
        (*input)++;
        (*inlen)--;
    }

    return param.output - output;
}